

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int arkEwtSetSS(N_Vector ycur,N_Vector weight,void *arkode_mem)

{
  realtype rVar1;
  
  N_VAbs(ycur,*(N_Vector *)((long)arkode_mem + 0x120));
  N_VScale(*(realtype *)((long)arkode_mem + 0x20),*(N_Vector *)((long)arkode_mem + 0x120),
           *(N_Vector *)((long)arkode_mem + 0x120));
  N_VAddConst(*(N_Vector *)((long)arkode_mem + 0x120),*(realtype *)((long)arkode_mem + 0x28),
              *(N_Vector *)((long)arkode_mem + 0x120));
  if ((*(int *)((long)arkode_mem + 0x38) != 0) &&
     (rVar1 = N_VMin(*(N_Vector *)((long)arkode_mem + 0x120)), rVar1 <= 0.0)) {
    return -1;
  }
  N_VInv(*(N_Vector *)((long)arkode_mem + 0x120),weight);
  return 0;
}

Assistant:

int arkEwtSetSS(N_Vector ycur, N_Vector weight, void* arkode_mem)
{
  ARKodeMem ark_mem = (ARKodeMem) arkode_mem;
  N_VAbs(ycur, ark_mem->tempv1);
  N_VScale(ark_mem->reltol, ark_mem->tempv1, ark_mem->tempv1);
  N_VAddConst(ark_mem->tempv1, ark_mem->Sabstol, ark_mem->tempv1);
  if (ark_mem->atolmin0) {
    if (N_VMin(ark_mem->tempv1) <= ZERO) return(-1);
  }
  N_VInv(ark_mem->tempv1, weight);
  return(0);
}